

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O2

void TIFFSwabArrayOfDouble(double *dp,tmsize_t n)

{
  double dVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [11];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [16];
  
  while (0 < n) {
    n = n + -1;
    dVar1 = *dp;
    auVar10._8_6_ = 0;
    auVar10._0_8_ = dVar1;
    auVar10[0xe] = (char)((ulong)dVar1 >> 0x38);
    auVar11._8_4_ = 0;
    auVar11._0_8_ = dVar1;
    auVar11[0xc] = (char)((ulong)dVar1 >> 0x30);
    auVar11._13_2_ = auVar10._13_2_;
    auVar12._8_4_ = 0;
    auVar12._0_8_ = dVar1;
    auVar12._12_3_ = auVar11._12_3_;
    auVar13._8_2_ = 0;
    auVar13._0_8_ = dVar1;
    auVar13[10] = (char)((ulong)dVar1 >> 0x28);
    auVar13._11_4_ = auVar12._11_4_;
    auVar14._8_2_ = 0;
    auVar14._0_8_ = dVar1;
    auVar14._10_5_ = auVar13._10_5_;
    auVar15[8] = (char)((ulong)dVar1 >> 0x20);
    auVar15._0_8_ = dVar1;
    auVar15._9_6_ = auVar14._9_6_;
    auVar22[7] = 0;
    auVar22._0_7_ = auVar15._8_7_;
    auVar18._7_8_ = 0;
    auVar18._0_7_ = auVar15._8_7_;
    auVar20._1_8_ = SUB158(auVar18 << 0x40,7);
    auVar20[0] = (char)((ulong)dVar1 >> 0x18);
    auVar20._9_6_ = 0;
    auVar19._1_10_ = SUB1510(auVar20 << 0x30,5);
    auVar19[0] = (char)((ulong)dVar1 >> 0x10);
    auVar21._11_4_ = 0;
    auVar21._0_11_ = auVar19;
    auVar16[2] = (char)((ulong)dVar1 >> 8);
    auVar16._0_2_ = SUB82(dVar1,0);
    auVar16._3_12_ = SUB1512(auVar21 << 0x20,3);
    auVar17._2_13_ = auVar16._2_13_;
    auVar17._0_2_ = SUB82(dVar1,0) & 0xff;
    auVar22._8_4_ = auVar17._0_4_;
    auVar22._12_4_ = auVar19._0_4_;
    auVar22 = pshuflw(auVar22,auVar22,0x1b);
    auVar22 = pshufhw(auVar22,auVar22,0x1b);
    sVar2 = auVar22._0_2_;
    sVar3 = auVar22._2_2_;
    sVar4 = auVar22._4_2_;
    sVar5 = auVar22._6_2_;
    sVar6 = auVar22._8_2_;
    sVar7 = auVar22._10_2_;
    sVar8 = auVar22._12_2_;
    sVar9 = auVar22._14_2_;
    *dp = (double)CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar22[0xe] - (0xff < sVar9),
                           CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar22[0xc] - (0xff < sVar8),
                                    CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar22[10] -
                                             (0xff < sVar7),
                                             CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar22[8] -
                                                      (0xff < sVar6),
                                                      CONCAT13((0 < sVar5) * (sVar5 < 0x100) *
                                                               auVar22[6] - (0xff < sVar5),
                                                               CONCAT12((0 < sVar4) *
                                                                        (sVar4 < 0x100) * auVar22[4]
                                                                        - (0xff < sVar4),
                                                                        CONCAT11((0 < sVar3) *
                                                                                 (sVar3 < 0x100) *
                                                                                 auVar22[2] -
                                                                                 (0xff < sVar3),
                                                                                 (0 < sVar2) *
                                                                                 (sVar2 < 0x100) *
                                                                                 auVar22[0] -
                                                                                 (0xff < sVar2))))))
                                   ));
    dp = dp + 1;
  }
  return;
}

Assistant:

void TIFFSwabArrayOfDouble(double *dp, tmsize_t n)
{
    register unsigned char *cp;
    register unsigned char t;
    assert(sizeof(double) == 8);
    /* XXX unroll loop some */
    while (n-- > 0)
    {
        cp = (unsigned char *)dp;
        t = cp[7];
        cp[7] = cp[0];
        cp[0] = t;
        t = cp[6];
        cp[6] = cp[1];
        cp[1] = t;
        t = cp[5];
        cp[5] = cp[2];
        cp[2] = t;
        t = cp[4];
        cp[4] = cp[3];
        cp[3] = t;
        dp++;
    }
}